

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O1

int glu::TextureTestUtil::computeTextureLookupDiff
              (ConstPixelBufferAccess *result,ConstPixelBufferAccess *reference,
              PixelBufferAccess *errorMask,TextureCubeArrayView *baseView,float *texCoord,
              ReferenceParams *sampleParams,LookupPrecision *lookupPrec,IVec4 *coordBits,
              LodPrecision *lodPrec,qpWatchDog *watchDog)

{
  float fVar1;
  bool bVar2;
  int i;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  int iVar10;
  int lodOffsNdx;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  TextureCubeArrayView TVar19;
  Vec2 lodBounds;
  Vector<float,_4> res_4;
  Vector<bool,_4> res_6;
  Vec3 coordDxo;
  Vec2 clampedLod;
  Vec4 refPix;
  Vec3 triS [2];
  Vec3 coordDyo;
  Vec4 resPix;
  Vec3 triW [2];
  Vec3 triQ [2];
  Vec3 triR [2];
  Vec3 triT [2];
  Vec2 lodO;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  Vec2 lodBias;
  TextureCubeArrayView src;
  Vec2 lodOffsets [8];
  undefined1 local_308 [36];
  float local_2e4;
  float local_2e0;
  float local_2dc;
  float local_2d8;
  float local_2d4;
  float local_2d0;
  float local_2cc;
  float local_2c8;
  float local_2c4;
  float local_2c0;
  float local_2bc;
  float local_2b8;
  float local_2b4;
  float local_2b0 [2];
  undefined1 local_2a8 [36];
  float local_284;
  ulong local_280;
  ConstPixelBufferAccess *local_278;
  Vec3 local_270;
  TextureFormat local_260;
  float local_258;
  float local_250;
  float local_24c;
  float local_248;
  float local_244;
  float local_240;
  float local_23c;
  float local_238;
  float local_234;
  float local_230;
  float local_22c;
  float local_228;
  float local_224;
  float local_220;
  float local_21c;
  float local_218;
  float local_214;
  float local_210;
  float local_20c;
  float local_208;
  float local_204;
  float local_200;
  float local_1fc;
  float local_1f8 [4];
  undefined1 local_1e8 [4];
  float local_1e4;
  undefined8 local_1e0;
  float local_1d8;
  float local_1d4;
  Vec3 local_1c4;
  Vec4 local_1b8;
  float local_1a8 [4];
  float local_198;
  float local_194;
  float local_188 [4];
  float local_178;
  float local_174;
  float local_168 [4];
  float local_158;
  float local_154;
  float local_148 [4];
  float local_138;
  float local_134;
  PixelBufferAccess *local_128;
  float local_120;
  float local_11c;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_118;
  ConstPixelBufferAccess *local_f8;
  ReferenceParams *local_f0;
  Sampler *local_e8;
  ulong local_e0;
  ulong local_d8;
  float afStack_d0 [2];
  undefined1 local_c8 [16];
  TextureCubeArrayView local_b8;
  undefined1 local_a8 [4];
  float fStack_a4;
  ConstPixelBufferAccess *pCStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  float local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_118.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar7 = sampleParams->baseLevel;
  iVar6 = baseView->m_numLevels + -1;
  iVar10 = iVar6;
  if (iVar7 < iVar6) {
    iVar10 = iVar7;
  }
  iVar8 = 0;
  if (-1 < iVar7) {
    iVar8 = iVar10;
  }
  iVar7 = sampleParams->maxLevel;
  if (iVar7 < iVar6) {
    iVar6 = iVar7;
  }
  iVar10 = 1;
  if (iVar8 <= iVar7) {
    iVar10 = (iVar6 - iVar8) + 1;
  }
  local_128 = errorMask;
  local_f8 = reference;
  tcu::TextureCubeArrayView::TextureCubeArrayView
            ((TextureCubeArrayView *)local_a8,iVar10,baseView->m_levels + iVar8);
  local_1e8 = local_a8;
  local_1e0 = pCStack_a0;
  local_e8 = &sampleParams->sampler;
  TVar19 = tcu::getEffectiveTextureView((TextureCubeArrayView *)local_1e8,&local_118,local_e8);
  local_b8.m_levels = TVar19.m_levels;
  local_b8.m_numLevels = TVar19.m_numLevels;
  local_1e8 = (undefined1  [4])*texCoord;
  local_148[0] = texCoord[1];
  local_1e4 = texCoord[4];
  local_1d8 = texCoord[8];
  local_148[1] = texCoord[5];
  local_148[2] = texCoord[9];
  local_148[3] = texCoord[0xd];
  local_168[0] = texCoord[2];
  local_168[1] = texCoord[6];
  local_168[2] = texCoord[10];
  local_168[3] = texCoord[0xe];
  local_188[0] = texCoord[3];
  local_188[1] = texCoord[7];
  local_188[2] = texCoord[0xb];
  local_188[3] = texCoord[0xf];
  if (local_b8.m_numLevels < 1) {
    iVar7 = 0;
  }
  else {
    iVar7 = ((local_b8.m_levels)->m_size).m_data[0];
  }
  fVar17 = (float)(result->m_size).m_data[0];
  local_2e4 = (float)(result->m_size).m_data[1];
  local_1e0 = (ConstPixelBufferAccess *)CONCAT44(texCoord[0xc],local_1d8);
  local_1a8[0] = (sampleParams->super_RenderParams).w.m_data[0];
  local_1a8[1] = (sampleParams->super_RenderParams).w.m_data[1];
  local_1a8[2] = (sampleParams->super_RenderParams).w.m_data[2];
  local_1a8[3] = (sampleParams->super_RenderParams).w.m_data[3];
  fVar11 = 0.0;
  if (((sampleParams->super_RenderParams).flags & 2) != 0) {
    fVar11 = (sampleParams->super_RenderParams).bias;
  }
  lVar3 = 0;
  do {
    afStack_d0[lVar3] = fVar11;
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  local_a8 = (undefined1  [4])0xbf800000;
  fStack_a4 = 0.0;
  pCStack_a0 = (ConstPixelBufferAccess *)0x3f800000;
  local_98 = 0xbf80000000000000;
  uStack_90 = 0x3f80000000000000;
  local_88 = 0xbf800000bf800000;
  uStack_80 = 0x3f800000bf800000;
  local_78 = 0xbf8000003f800000;
  uStack_70 = 0x3f8000003f800000;
  local_1f8[0] = -1.7146522e+38;
  local_1d4 = local_1e4;
  local_198 = local_1a8[2];
  local_194 = local_1a8[1];
  local_178 = local_188[2];
  local_174 = local_188[1];
  local_158 = local_168[2];
  local_154 = local_168[1];
  local_138 = local_148[2];
  local_134 = local_148[1];
  tcu::RGBA::toVec((RGBA *)&local_1b8);
  tcu::clear(local_128,&local_1b8);
  if ((result->m_size).m_data[1] < 1) {
    local_280 = 0;
  }
  else {
    local_280 = 0;
    iVar10 = 0;
    local_278 = result;
    local_f0 = sampleParams;
    do {
      if (watchDog != (qpWatchDog *)0x0) {
        qpWatchDog_touch(watchDog);
      }
      if (0 < (local_278->m_size).m_data[0]) {
        local_2d0 = (float)iVar10 + 0.5;
        local_2d8 = local_2d0 / local_2e4;
        local_24c = local_2e4 - local_2d0;
        local_250 = 1.0 - local_2d8;
        iVar6 = 0;
        local_308._28_4_ = iVar10;
        do {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_308,(int)local_278,iVar6,iVar10);
          local_1f8[0] = 0.0;
          local_1f8[1] = 0.0;
          local_1f8[2] = 0.0;
          local_1f8[3] = 0.0;
          lVar3 = 0;
          do {
            local_1f8[lVar3] =
                 *(float *)(local_308 + lVar3 * 4) -
                 (sampleParams->super_RenderParams).colorBias.m_data[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 4);
          local_1b8.m_data[0] = 0.0;
          local_1b8.m_data[1] = 0.0;
          local_1b8.m_data[2] = 0.0;
          local_1b8.m_data[3] = 0.0;
          lVar3 = 0;
          do {
            local_1b8.m_data[lVar3] =
                 local_1f8[lVar3] / (sampleParams->super_RenderParams).colorScale.m_data[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 4);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_2a8,(int)local_f8,iVar6,iVar10);
          local_308._0_4_ = R;
          local_308._4_4_ = SNORM_INT8;
          local_308._8_4_ = 0;
          local_308._12_4_ = 0;
          lVar3 = 0;
          do {
            *(float *)(local_308 + lVar3 * 4) =
                 *(float *)(local_2a8 + lVar3 * 4) -
                 (sampleParams->super_RenderParams).colorBias.m_data[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 4);
          local_1f8[0] = 0.0;
          local_1f8[1] = 0.0;
          local_1f8[2] = 0.0;
          local_1f8[3] = 0.0;
          lVar3 = 0;
          do {
            local_1f8[lVar3] =
                 *(float *)(local_308 + lVar3 * 4) /
                 (sampleParams->super_RenderParams).colorScale.m_data[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 4);
          local_2a8._0_4_ = R;
          local_2a8._4_4_ = SNORM_INT8;
          local_2a8._8_4_ = 0;
          local_2a8._12_4_ = 0;
          lVar3 = 0;
          do {
            *(float *)(local_2a8 + lVar3 * 4) = local_1b8.m_data[lVar3] - local_1f8[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 4);
          local_308._0_4_ = R;
          local_308._4_4_ = SNORM_INT8;
          local_308._8_4_ = 0;
          local_308._12_4_ = 0;
          lVar3 = 0;
          do {
            fVar11 = *(float *)(local_2a8 + lVar3 * 4);
            fVar12 = -fVar11;
            if (-fVar11 <= fVar11) {
              fVar12 = fVar11;
            }
            *(float *)(local_308 + lVar3 * 4) = fVar12;
            lVar3 = lVar3 + 1;
          } while (lVar3 != 4);
          local_2a8._28_4_ = 0.0;
          lVar3 = 0;
          do {
            local_2a8[lVar3 + 0x1c] =
                 *(float *)(local_308 + lVar3 * 4) <= (lookupPrec->colorThreshold).m_data[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 4);
          if (local_2a8[0x1c] == '\0') {
LAB_00854a84:
            local_308._32_4_ = (float)iVar6 + 0.5;
            local_2d4 = (float)local_308._32_4_ / fVar17;
            fVar11 = local_2d8 + local_2d4 + -0.05882353;
            fVar12 = local_2d8 + local_2d4 + 0.05882353;
            if ((fVar11 <= 1.0) || (1.0 <= fVar12)) {
              local_e0 = (ulong)(1.0 <= fVar12);
              uVar5 = (ulong)(1.0 < fVar11);
              local_244 = fVar17 - (float)local_308._32_4_;
              local_248 = 1.0 - local_2d4;
              bVar9 = false;
              do {
                local_2c8 = (float)local_308._32_4_;
                local_2cc = local_2d0;
                fVar11 = local_2d8;
                fVar12 = local_2d4;
                if (uVar5 != 0) {
                  local_2c8 = local_244;
                  local_2cc = local_24c;
                  fVar11 = local_250;
                  fVar12 = local_248;
                }
                local_d8 = uVar5;
                fVar1 = *(float *)(local_1e8 + uVar5 * 0xc);
                local_1fc = (&local_1e4)[uVar5 * 3];
                fVar13 = (1.0 - fVar12) - fVar11;
                fVar14 = local_1a8[uVar5 * 3];
                local_c8 = ZEXT416((uint)fVar14);
                local_200 = local_1a8[uVar5 * 3 + 1];
                local_2b4 = *(float *)((long)&local_1e0 + uVar5 * 0xc);
                local_204 = local_1a8[uVar5 * 3 + 2];
                fVar16 = fVar12 / local_204 + fVar11 / local_200 + fVar13 / fVar14;
                local_2dc = local_148[uVar5 * 3];
                local_2b8 = local_148[uVar5 * 3 + 1];
                local_2bc = local_148[uVar5 * 3 + 2];
                local_2c0 = local_168[uVar5 * 3];
                local_2e0 = local_168[uVar5 * 3 + 1];
                local_2c4 = local_168[uVar5 * 3 + 2];
                local_308._0_4_ =
                     ((fVar12 * local_2b4) / local_204 +
                     (fVar11 * local_1fc) / local_200 + (fVar13 * fVar1) / fVar14) / fVar16;
                local_308._4_4_ =
                     ((fVar12 * local_2bc) / local_204 +
                     (fVar11 * local_2b8) / local_200 + (fVar13 * local_2dc) / fVar14) / fVar16;
                local_258 = ((fVar12 * local_2c4) / local_204 +
                            (fVar11 * local_2e0) / local_200 + (fVar13 * local_2c0) / fVar14) /
                            fVar16;
                local_308._12_4_ =
                     ((local_188[uVar5 * 3 + 2] * fVar12) / local_204 +
                     (local_188[uVar5 * 3 + 1] * fVar11) / local_200 +
                     (fVar13 * local_188[uVar5 * 3]) / fVar14) / fVar16;
                local_308._8_4_ = local_258;
                local_208 = local_204 * fVar17;
                local_20c = local_200 * local_204;
                fVar16 = fVar11 + -1.0;
                fVar15 = (fVar17 * fVar16 + (float)local_308._32_4_) * local_20c -
                         (local_208 * fVar11 + (float)local_308._32_4_ * local_200) * fVar14;
                local_210 = (local_1fc - fVar1) * local_204 + (local_2b4 - local_1fc) * fVar14;
                local_214 = (fVar1 - local_2b4) * local_200;
                local_218 = (local_2b8 - local_2dc) * local_204 + (local_2bc - local_2b8) * fVar14;
                local_21c = (local_2dc - local_2bc) * local_200;
                local_220 = (local_2e0 - local_2c0) * local_204 + (local_2c4 - local_2e0) * fVar14;
                local_224 = (local_2c0 - local_2c4) * local_200;
                fVar18 = fVar14 * local_200 * local_204;
                fVar13 = fVar18 * fVar17;
                fVar15 = fVar15 * fVar15;
                local_58 = ZEXT416((uint)fVar13);
                local_2a8._4_4_ = ((local_21c * fVar16 + fVar11 * local_218) * fVar13) / fVar15;
                local_2a8._0_4_ = ((local_214 * fVar16 + fVar11 * local_210) * fVar13) / fVar15;
                local_2a8._8_4_ = ((fVar16 * local_224 + fVar11 * local_220) * fVar13) / fVar15;
                local_228 = local_200 * local_2e4;
                fVar11 = fVar12 + -1.0;
                local_284 = (local_2e4 * fVar11 + local_2d0) * local_20c -
                            (local_228 * fVar12 + local_2d0 * local_204) * fVar14;
                local_22c = (local_1fc - local_2b4) * fVar14 + (local_2b4 - fVar1) * local_200;
                local_230 = (fVar1 - local_1fc) * local_204;
                local_234 = (local_2b8 - local_2bc) * fVar14 + (local_2bc - local_2dc) * local_200;
                local_238 = (local_2dc - local_2b8) * local_204;
                local_23c = (local_2e0 - local_2c4) * fVar14 + (local_2c4 - local_2c0) * local_200;
                local_240 = (local_2c0 - local_2e0) * local_204;
                fVar18 = fVar18 * local_2e4;
                local_284 = local_284 * local_284;
                local_2a8._28_4_ = ((local_230 * fVar11 + fVar12 * local_22c) * fVar18) / local_284;
                local_2a8._32_4_ = ((local_238 * fVar11 + fVar12 * local_234) * fVar18) / local_284;
                local_48 = ZEXT416((uint)fVar18);
                local_284 = ((fVar11 * local_240 + fVar12 * local_23c) * fVar18) / local_284;
                local_260.order = local_308._0_4_;
                local_260.type = local_308._4_4_;
                tcu::computeCubeLodBoundsFromDerivates
                          ((tcu *)local_2b0,(Vec3 *)&local_260,(Vec3 *)local_2a8,
                           (Vec3 *)(local_2a8 + 0x1c),iVar7,lodPrec);
                local_68 = -(float)local_c8._0_4_;
                uStack_64 = local_c8._4_4_ ^ 0x80000000;
                uStack_60 = local_c8._8_4_ ^ 0x80000000;
                uStack_5c = local_c8._12_4_ ^ 0x80000000;
                lVar3 = 0;
                do {
                  fVar13 = *(float *)(local_a8 + lVar3 * 8) + local_2c8;
                  fVar12 = *(float *)(local_a8 + lVar3 * 8 + 4) + local_2cc;
                  fVar11 = fVar13 / fVar17;
                  fVar14 = fVar12 / local_2e4;
                  fVar16 = (1.0 - fVar11) - fVar14;
                  fVar15 = fVar11 / local_204 + fVar14 / local_200 + fVar16 / (float)local_c8._0_4_;
                  local_258 = ((local_2c4 * fVar11) / local_204 +
                              (local_2e0 * fVar14) / local_200 +
                              (fVar16 * local_2c0) / (float)local_c8._0_4_) / fVar15;
                  local_260.type =
                       (ChannelType)
                       (((local_2bc * fVar11) / local_204 +
                        (local_2b8 * fVar14) / local_200 +
                        (local_2dc * fVar16) / (float)local_c8._0_4_) / fVar15);
                  local_260.order =
                       (ChannelOrder)
                       (((local_2b4 * fVar11) / local_204 +
                        (local_1fc * fVar14) / local_200 + (fVar1 * fVar16) / (float)local_c8._0_4_)
                       / fVar15);
                  fVar16 = fVar14 + -1.0;
                  fVar13 = (fVar17 * fVar16 + fVar13) * local_20c +
                           (local_208 * fVar14 + fVar13 * local_200) * local_68;
                  fVar13 = fVar13 * fVar13;
                  local_270.m_data[2] =
                       ((fVar16 * local_224 + fVar14 * local_220) * (float)local_58._0_4_) / fVar13;
                  local_270.m_data[1] =
                       ((local_21c * fVar16 + local_218 * fVar14) * (float)local_58._0_4_) / fVar13;
                  local_270.m_data[0] =
                       ((local_214 * fVar16 + local_210 * fVar14) * (float)local_58._0_4_) / fVar13;
                  fVar14 = fVar11 + -1.0;
                  fVar12 = (local_2e4 * fVar14 + fVar12) * local_20c +
                           (local_228 * fVar11 + fVar12 * local_204) * local_68;
                  fVar12 = fVar12 * fVar12;
                  local_1c4.m_data[2] =
                       ((fVar14 * local_240 + fVar11 * local_23c) * (float)local_48._0_4_) / fVar12;
                  local_1c4.m_data[1] =
                       ((local_238 * fVar14 + local_234 * fVar11) * (float)local_48._0_4_) / fVar12;
                  local_1c4.m_data[0] =
                       ((local_230 * fVar14 + local_22c * fVar11) * (float)local_48._0_4_) / fVar12;
                  tcu::computeCubeLodBoundsFromDerivates
                            ((tcu *)&local_120,(Vec3 *)&local_260,&local_270,&local_1c4,iVar7,
                             lodPrec);
                  sampleParams = local_f0;
                  local_2b0[0] = (float)(~-(uint)(local_2b0[0] <= local_120) & (uint)local_120 |
                                        (uint)local_2b0[0] & -(uint)(local_2b0[0] <= local_120));
                  local_2b0[1] = (float)(~-(uint)(local_11c <= local_2b0[1]) & (uint)local_11c |
                                        (uint)local_2b0[1] & -(uint)(local_11c <= local_2b0[1]));
                  lVar3 = lVar3 + 1;
                } while (lVar3 != 8);
                local_270.m_data[0] = 0.0;
                local_270.m_data[1] = 0.0;
                lVar3 = 0;
                do {
                  local_270.m_data[lVar3] = local_2b0[lVar3] + afStack_d0[lVar3];
                  lVar3 = lVar3 + 1;
                } while (lVar3 == 1);
                local_1c4.m_data[0] = local_f0->minLod;
                local_1c4.m_data[1] = local_f0->maxLod;
                tcu::clampLodBounds((tcu *)&local_260,(Vec2 *)&local_270,(Vec2 *)&local_1c4,lodPrec)
                ;
                bVar2 = tcu::isLookupResultValid
                                  (&local_b8,local_e8,lookupPrec,coordBits,(Vec4 *)local_308,
                                   (Vec2 *)&local_260,&local_1b8);
                if (bVar2) {
                  bVar9 = true;
                }
                uVar5 = local_d8 + 1;
              } while (local_d8 < local_e0 && !bVar2);
              iVar10 = local_308._28_4_;
              if (bVar9) goto LAB_008555db;
            }
            local_2a8._0_4_ = 0xff0000ff;
            tcu::RGBA::toVec((RGBA *)local_308);
            tcu::PixelBufferAccess::setPixel(local_128,(Vec4 *)local_308,iVar6,local_308._28_4_,0);
            local_280 = (ulong)((int)local_280 + 1);
            iVar10 = local_308._28_4_;
          }
          else {
            uVar5 = 0;
            do {
              uVar4 = uVar5;
              if (uVar4 == 3) break;
              uVar5 = uVar4 + 1;
            } while (local_2a8[uVar4 + 0x1d] != '\0');
            if (uVar4 < 3) goto LAB_00854a84;
          }
LAB_008555db:
          iVar6 = iVar6 + 1;
        } while (iVar6 < (local_278->m_size).m_data[0]);
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < (local_278->m_size).m_data[1]);
  }
  if (local_118.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.
                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (int)local_280;
}

Assistant:

int computeTextureLookupDiff (const tcu::ConstPixelBufferAccess&	result,
							  const tcu::ConstPixelBufferAccess&	reference,
							  const tcu::PixelBufferAccess&			errorMask,
							  const tcu::TextureCubeArrayView&		baseView,
							  const float*							texCoord,
							  const ReferenceParams&				sampleParams,
							  const tcu::LookupPrecision&			lookupPrec,
							  const tcu::IVec4&						coordBits,
							  const tcu::LodPrecision&				lodPrec,
							  qpWatchDog*							watchDog)
{
	DE_ASSERT(result.getWidth() == reference.getWidth() && result.getHeight() == reference.getHeight());
	DE_ASSERT(result.getWidth() == errorMask.getWidth() && result.getHeight() == errorMask.getHeight());

	std::vector<tcu::ConstPixelBufferAccess>	srcLevelStorage;
	const tcu::TextureCubeArrayView				src					= getEffectiveTextureView(getSubView(baseView, sampleParams.baseLevel, sampleParams.maxLevel), srcLevelStorage, sampleParams.sampler);

	const tcu::Vec4								sq					= tcu::Vec4(texCoord[0+0], texCoord[4+0], texCoord[8+0], texCoord[12+0]);
	const tcu::Vec4								tq					= tcu::Vec4(texCoord[0+1], texCoord[4+1], texCoord[8+1], texCoord[12+1]);
	const tcu::Vec4								rq					= tcu::Vec4(texCoord[0+2], texCoord[4+2], texCoord[8+2], texCoord[12+2]);
	const tcu::Vec4								qq					= tcu::Vec4(texCoord[0+3], texCoord[4+3], texCoord[8+3], texCoord[12+3]);

	const tcu::IVec2							dstSize				= tcu::IVec2(result.getWidth(), result.getHeight());
	const float									dstW				= float(dstSize.x());
	const float									dstH				= float(dstSize.y());
	const int									srcSize				= src.getSize();

	// Coordinates per triangle.
	const tcu::Vec3								triS[2]				= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	const tcu::Vec3								triT[2]				= { tq.swizzle(0, 1, 2), tq.swizzle(3, 2, 1) };
	const tcu::Vec3								triR[2]				= { rq.swizzle(0, 1, 2), rq.swizzle(3, 2, 1) };
	const tcu::Vec3								triQ[2]				= { qq.swizzle(0, 1, 2), qq.swizzle(3, 2, 1) };
	const tcu::Vec3								triW[2]				= { sampleParams.w.swizzle(0, 1, 2), sampleParams.w.swizzle(3, 2, 1) };

	const tcu::Vec2								lodBias				((sampleParams.flags & ReferenceParams::USE_BIAS) ? sampleParams.bias : 0.0f);

	const float									posEps				= 1.0f / float((1<<4) + 1); // ES3 requires at least 4 subpixel bits.

	int											numFailed			= 0;

	const tcu::Vec2 lodOffsets[] =
	{
		tcu::Vec2(-1,  0),
		tcu::Vec2(+1,  0),
		tcu::Vec2( 0, -1),
		tcu::Vec2( 0, +1),

		// \note Not strictly allowed by spec, but implementations do this in practice.
		tcu::Vec2(-1, -1),
		tcu::Vec2(-1, +1),
		tcu::Vec2(+1, -1),
		tcu::Vec2(+1, +1),
	};

	tcu::clear(errorMask, tcu::RGBA::green().toVec());

	for (int py = 0; py < result.getHeight(); py++)
	{
		// Ugly hack, validation can take way too long at the moment.
		if (watchDog)
			qpWatchDog_touch(watchDog);

		for (int px = 0; px < result.getWidth(); px++)
		{
			const tcu::Vec4	resPix	= (result.getPixel(px, py)		- sampleParams.colorBias) / sampleParams.colorScale;
			const tcu::Vec4	refPix	= (reference.getPixel(px, py)	- sampleParams.colorBias) / sampleParams.colorScale;

			// Try comparison to ideal reference first, and if that fails use slower verificator.
			if (!tcu::boolAll(tcu::lessThanEqual(tcu::abs(resPix - refPix), lookupPrec.colorThreshold)))
			{
				const float		wx		= (float)px + 0.5f;
				const float		wy		= (float)py + 0.5f;
				const float		nx		= wx / dstW;
				const float		ny		= wy / dstH;

				const bool		tri0	= nx + ny - posEps <= 1.0f;
				const bool		tri1	= nx + ny + posEps >= 1.0f;

				bool			isOk	= false;

				DE_ASSERT(tri0 || tri1);

				// Pixel can belong to either of the triangles if it lies close enough to the edge.
				for (int triNdx = (tri0?0:1); triNdx <= (tri1?1:0); triNdx++)
				{
					const float		triWx		= triNdx ? dstW - wx : wx;
					const float		triWy		= triNdx ? dstH - wy : wy;
					const float		triNx		= triNdx ? 1.0f - nx : nx;
					const float		triNy		= triNdx ? 1.0f - ny : ny;

					const tcu::Vec4	coord		(projectedTriInterpolate(triS[triNdx], triW[triNdx], triNx, triNy),
												 projectedTriInterpolate(triT[triNdx], triW[triNdx], triNx, triNy),
												 projectedTriInterpolate(triR[triNdx], triW[triNdx], triNx, triNy),
												 projectedTriInterpolate(triQ[triNdx], triW[triNdx], triNx, triNy));
					const tcu::Vec3	coordDx		(triDerivateX(triS[triNdx], triW[triNdx], wx, dstW, triNy),
												 triDerivateX(triT[triNdx], triW[triNdx], wx, dstW, triNy),
												 triDerivateX(triR[triNdx], triW[triNdx], wx, dstW, triNy));
					const tcu::Vec3	coordDy		(triDerivateY(triS[triNdx], triW[triNdx], wy, dstH, triNx),
												 triDerivateY(triT[triNdx], triW[triNdx], wy, dstH, triNx),
												 triDerivateY(triR[triNdx], triW[triNdx], wy, dstH, triNx));

					tcu::Vec2		lodBounds	= tcu::computeCubeLodBoundsFromDerivates(coord.toWidth<3>(), coordDx, coordDy, srcSize, lodPrec);

					// Compute lod bounds across lodOffsets range.
					for (int lodOffsNdx = 0; lodOffsNdx < DE_LENGTH_OF_ARRAY(lodOffsets); lodOffsNdx++)
					{
						const float		wxo			= triWx + lodOffsets[lodOffsNdx].x();
						const float		wyo			= triWy + lodOffsets[lodOffsNdx].y();
						const float		nxo			= wxo/dstW;
						const float		nyo			= wyo/dstH;

						const tcu::Vec3	coordO		(projectedTriInterpolate(triS[triNdx], triW[triNdx], nxo, nyo),
													 projectedTriInterpolate(triT[triNdx], triW[triNdx], nxo, nyo),
													 projectedTriInterpolate(triR[triNdx], triW[triNdx], nxo, nyo));
						const tcu::Vec3	coordDxo	(triDerivateX(triS[triNdx], triW[triNdx], wxo, dstW, nyo),
													 triDerivateX(triT[triNdx], triW[triNdx], wxo, dstW, nyo),
													 triDerivateX(triR[triNdx], triW[triNdx], wxo, dstW, nyo));
						const tcu::Vec3	coordDyo	(triDerivateY(triS[triNdx], triW[triNdx], wyo, dstH, nxo),
													 triDerivateY(triT[triNdx], triW[triNdx], wyo, dstH, nxo),
													 triDerivateY(triR[triNdx], triW[triNdx], wyo, dstH, nxo));
						const tcu::Vec2	lodO		= tcu::computeCubeLodBoundsFromDerivates(coordO, coordDxo, coordDyo, srcSize, lodPrec);

						lodBounds.x() = de::min(lodBounds.x(), lodO.x());
						lodBounds.y() = de::max(lodBounds.y(), lodO.y());
					}

					const tcu::Vec2	clampedLod	= tcu::clampLodBounds(lodBounds + lodBias, tcu::Vec2(sampleParams.minLod, sampleParams.maxLod), lodPrec);

					if (tcu::isLookupResultValid(src, sampleParams.sampler, lookupPrec, coordBits, coord, clampedLod, resPix))
					{
						isOk = true;
						break;
					}
				}

				if (!isOk)
				{
					errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
					numFailed += 1;
				}
			}
		}
	}

	return numFailed;
}